

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__gif_lzw *psVar1;
  undefined8 *puVar2;
  uchar uVar3;
  undefined1 uVar4;
  short sVar5;
  undefined8 uVar6;
  int *piVar7;
  short sVar8;
  stbi__context *psVar9;
  char *pcVar10;
  byte bVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  byte bVar18;
  int iVar19;
  stbi__gif_lzw sVar20;
  stbi__gif_lzw sVar21;
  stbi__gif_lzw sVar22;
  int iVar23;
  int iVar24;
  stbi__gif_lzw sVar25;
  stbi__uint32 sVar26;
  stbi__uint32 sVar27;
  stbi__uint32 sVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  stbi__gif *g;
  long lVar37;
  uchar *puVar38;
  float *data;
  stbi_uc *psVar39;
  void *pvVar40;
  code *pcVar41;
  stbi__context *psVar42;
  stbi_uc *psVar43;
  undefined1 *puVar44;
  int iVar45;
  ulong uVar46;
  stbi__gif_lzw sVar48;
  short sVar47;
  uint uVar49;
  int iVar50;
  uint n;
  short *data_00;
  size_t __size;
  ulong uVar51;
  stbi_uc *psVar52;
  uchar *puVar53;
  stbi_uc (*pal) [4];
  int id;
  uint uVar54;
  byte *pbVar55;
  stbi__gif_lzw sVar56;
  int iVar57;
  uint uVar58;
  long lVar59;
  long lVar60;
  stbi__gif_lzw *psVar61;
  float *pfVar62;
  uint uVar63;
  uint *puVar64;
  int left;
  uint uVar65;
  int iVar66;
  ulong uVar67;
  ulong uVar68;
  stbi_uc **ppsVar69;
  bool bVar70;
  float fVar71;
  float fVar72;
  uint local_4890;
  stbi_uc *local_4848;
  uint local_4804;
  int local_47fc;
  int local_47f8;
  int local_47f4;
  stbi_uc *coutput [4];
  stbi__jpeg j;
  
  j.idct_block_kernel = stbi__idct_block;
  j.YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_row;
  j.resample_row_hv_2_kernel = stbi__resample_row_hv_2;
  j.s = s;
  iVar19 = stbi__decode_jpeg_header(&j,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    g = (stbi__gif *)malloc(0x4780);
    *(stbi__context **)g = s;
    *(code **)(g->codes + 0xfce) = stbi__idct_block;
    *(code **)(g->codes + 0xfd0) = stbi__YCbCr_to_RGB_row;
    *(code **)(g->codes + 0xfd2) = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar37 = 0x45d8; lVar37 != 0x4758; lVar37 = lVar37 + 0x60) {
        puVar2 = (undefined8 *)((long)&((stbi__gif *)(g->pal + -0xc))->w + lVar37);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      g->codes[0xfcc].prefix = 0;
      g->codes[0xfcc].first = '\0';
      g->codes[0xfcc].suffix = '\0';
      iVar19 = stbi__decode_jpeg_header((stbi__jpeg *)g,0);
      if (iVar19 != 0) {
        psVar1 = g->codes + 0xf5c;
        bVar11 = stbi__get_marker((stbi__jpeg *)g);
        while (bVar11 == 0xda) {
          iVar19 = stbi__get16be(*(stbi__context **)g);
          sVar20.prefix._0_1_ = stbi__get8(*(stbi__context **)g);
          sVar20._1_3_ = 0;
          sVar21._1_3_ = 0;
          sVar21.prefix._0_1_ = (byte)sVar20.prefix;
          g->codes[0xfc7] = sVar21;
          if (((byte)((byte)sVar20.prefix - 5) < 0xfc) ||
             (psVar42 = *(stbi__context **)g, psVar42->img_n < (int)(uint)(byte)sVar20.prefix)) {
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_0012e565;
          }
          if (iVar19 != (uint)(byte)sVar20.prefix * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_0012e565;
          }
          lVar37 = 0;
          while( true ) {
            bVar11 = stbi__get8(psVar42);
            sVar25._1_3_ = 0;
            sVar25.prefix._0_1_ = bVar11;
            if ((int)sVar20 <= lVar37) break;
            bVar11 = stbi__get8(*(stbi__context **)g);
            psVar42 = *(stbi__context **)g;
            sVar20 = (stbi__gif_lzw)psVar42->img_n;
            uVar46 = 0;
            if (0 < (int)sVar20) {
              uVar46 = (ulong)(uint)sVar20;
            }
            psVar61 = psVar1;
            for (uVar68 = 0; uVar46 != uVar68; uVar68 = uVar68 + 1) {
              if (*psVar61 == sVar25) {
                uVar46 = uVar68 & 0xffffffff;
                break;
              }
              psVar61 = psVar61 + 0x18;
            }
            if (SUB84(uVar46,0) == sVar20) goto LAB_0012e565;
            sVar56._1_3_ = 0;
            sVar56.prefix._0_1_ = bVar11 >> 4;
            g->codes[uVar46 * 0x18 + 0xf60] = sVar56;
            if (0x3f < bVar11) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_0012e565;
            }
            psVar1[uVar46 * 0x18 + 5] = (stbi__gif_lzw)(bVar11 & 0xf);
            if (3 < (bVar11 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_0012e565;
            }
            g->codes[lVar37 + 0xfc8] = SUB84(uVar46,0);
            lVar37 = lVar37 + 1;
            sVar20 = g->codes[0xfc7];
          }
          g->codes[0xfc1] = sVar25;
          sVar22.prefix._0_1_ = stbi__get8(*(stbi__context **)g);
          sVar22._1_3_ = 0;
          g->codes[0xfc2] = sVar22;
          bVar11 = stbi__get8(*(stbi__context **)g);
          sVar48._1_3_ = 0;
          sVar48.prefix._0_1_ = bVar11 >> 4;
          g->codes[0xfc3] = sVar48;
          g->codes[0xfc4] = (stbi__gif_lzw)(bVar11 & 0xf);
          sVar20 = g->codes[0xfc1];
          if (g->codes[0xfc0] == (stbi__gif_lzw)0x0) {
            if ((sVar20 != (stbi__gif_lzw)0x0) || ((0xf < bVar11 || ((bVar11 & 0xf) != 0)))) {
LAB_0012e06b:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0012e565;
            }
            g->codes[0xfc2].prefix = 0x3f;
            g->codes[0xfc2].first = '\0';
            g->codes[0xfc2].suffix = '\0';
          }
          else if ((((0x3f < (int)sVar20) || (0x3f < (int)g->codes[0xfc2])) ||
                   ((int)g->codes[0xfc2] < (int)sVar20)) ||
                  ((0xdf < bVar11 || (0xd < (bVar11 & 0xf))))) goto LAB_0012e06b;
          stbi__jpeg_reset((stbi__jpeg *)g);
          if (g->codes[0xfc0] == (stbi__gif_lzw)0x0) {
            if (g->codes[0xfc7] == (stbi__gif_lzw)0x1) {
              sVar20 = g->codes[0xfc8];
              lVar37 = (long)(int)sVar20;
              uVar63 = (int)g->codes[lVar37 * 0x18 + 0xf63] + 7 >> 3;
              iVar19 = (int)g->codes[lVar37 * 0x18 + 0xf64] + 7 >> 3;
              if ((int)uVar63 < 1) {
                uVar63 = 0;
              }
              iVar29 = 0;
              if (iVar19 < 1) {
                iVar19 = 0;
              }
              for (iVar57 = 0; iVar57 != iVar19; iVar57 = iVar57 + 1) {
                for (lVar59 = 0; (ulong)uVar63 * 8 != lVar59; lVar59 = lVar59 + 8) {
                  iVar45 = stbi__jpeg_decode_block
                                     ((stbi__jpeg *)g,(short *)&j,
                                      (stbi__huffman *)
                                      (g->pal + (long)(int)psVar1[lVar37 * 0x18 + 4] * 0x1a4 + -10),
                                      (stbi__huffman *)
                                      (g->codes +
                                      (long)(int)psVar1[lVar37 * 0x18 + 5] * 0x1a4 + 0x486),
                                      &g->codes[(long)(int)psVar1[lVar37 * 0x18 + 5] * 0x100 + 0xb56
                                               ].prefix,(int)sVar20,
                                      (stbi_uc *)
                                      (g->codes +
                                      (long)(int)psVar1[lVar37 * 0x18 + 3] * 0x10 + 0xb16));
                  if (iVar45 == 0) {
                    bVar70 = false;
                    goto LAB_0012d302;
                  }
                  (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                            ((stbi_uc *)
                             (*(long *)(psVar1 + lVar37 * 0x18 + 0xc) +
                             lVar59 + iVar29 * (int)psVar1[lVar37 * 0x18 + 9]),
                             (int)psVar1[lVar37 * 0x18 + 9],(short *)&j);
                  sVar21 = g->codes[0xfcd];
                  g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar21 + -1);
                  if ((int)sVar21 < 2) {
                    if ((int)g->codes[0xfbd] < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                    }
                    if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_0012d2ff;
                    stbi__jpeg_reset((stbi__jpeg *)g);
                  }
                }
                iVar29 = iVar29 + 8;
              }
            }
            else {
              for (iVar19 = 0; iVar19 < (int)g->codes[0xf59]; iVar19 = iVar19 + 1) {
                for (iVar29 = 0; iVar29 < (int)g->codes[0xf58]; iVar29 = iVar29 + 1) {
                  for (lVar37 = 0; lVar37 < (int)g->codes[0xfc7]; lVar37 = lVar37 + 1) {
                    sVar20 = g->codes[lVar37 + 0xfc8];
                    for (iVar57 = 0; iVar57 < (int)psVar1[(long)(int)sVar20 * 0x18 + 2];
                        iVar57 = iVar57 + 1) {
                      for (iVar45 = 0; sVar21 = psVar1[(long)(int)sVar20 * 0x18 + 1],
                          iVar45 < (int)sVar21; iVar45 = iVar45 + 1) {
                        sVar25 = psVar1[(long)(int)sVar20 * 0x18 + 2];
                        iVar23 = stbi__jpeg_decode_block
                                           ((stbi__jpeg *)g,(short *)&j,
                                            (stbi__huffman *)
                                            (g->pal + (long)(int)psVar1[(long)(int)sVar20 * 0x18 + 4
                                                                       ] * 0x1a4 + -10),
                                            (stbi__huffman *)
                                            (g->codes +
                                            (long)(int)psVar1[(long)(int)sVar20 * 0x18 + 5] * 0x1a4
                                            + 0x486),&g->codes[(long)(int)psVar1[(long)(int)sVar20 *
                                                                                 0x18 + 5] * 0x100 +
                                                               0xb56].prefix,(int)sVar20,
                                            (stbi_uc *)
                                            (g->codes +
                                            (long)(int)psVar1[(long)(int)sVar20 * 0x18 + 3] * 0x10 +
                                            0xb16));
                        if (iVar23 == 0) {
                          bVar70 = false;
                          goto LAB_0012d302;
                        }
                        (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                  ((stbi_uc *)
                                   (*(long *)(psVar1 + (long)(int)sVar20 * 0x18 + 0xc) +
                                   (long)(((int)sVar21 * iVar29 + iVar45) * 8) +
                                   (long)(((int)sVar25 * iVar19 + iVar57) *
                                          (int)psVar1[(long)(int)sVar20 * 0x18 + 9] * 8)),
                                   (int)psVar1[(long)(int)sVar20 * 0x18 + 9],(short *)&j);
                      }
                    }
                  }
                  sVar20 = g->codes[0xfcd];
                  g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar20 + -1);
                  if ((int)sVar20 < 2) {
                    if ((int)g->codes[0xfbd] < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                    }
                    if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_0012d2ff;
                    stbi__jpeg_reset((stbi__jpeg *)g);
                  }
                }
              }
            }
LAB_0012d2ff:
            bVar70 = true;
LAB_0012d302:
            if (!bVar70) goto LAB_0012e565;
          }
          else if (g->codes[0xfc7] == (stbi__gif_lzw)0x1) {
            sVar20 = g->codes[0xfc8];
            lVar37 = (long)(int)sVar20;
            iVar29 = (int)g->codes[lVar37 * 0x18 + 0xf63] + 7 >> 3;
            iVar19 = (int)g->codes[lVar37 * 0x18 + 0xf64] + 7 >> 3;
            iVar57 = 0;
            if (iVar29 < 1) {
              iVar29 = 0;
            }
            if (iVar19 < 1) {
              iVar19 = iVar57;
            }
            for (; iVar57 != iVar19; iVar57 = iVar57 + 1) {
              for (iVar45 = 0; iVar45 != iVar29; iVar45 = iVar45 + 1) {
                data_00 = (short *)(*(long *)(psVar1 + lVar37 * 0x18 + 0x14) +
                                   (long)(((int)psVar1[lVar37 * 0x18 + 0x16] * iVar57 + iVar45) *
                                         0x40) * 2);
                uVar46 = (ulong)(int)g->codes[0xfc1];
                if (uVar46 == 0) {
                  iVar23 = stbi__jpeg_decode_block_prog_dc
                                     ((stbi__jpeg *)g,data_00,
                                      (stbi__huffman *)
                                      (g->pal + (long)(int)psVar1[lVar37 * 0x18 + 4] * 0x1a4 + -10),
                                      (int)sVar20);
                  if (iVar23 == 0) goto LAB_0012e565;
                }
                else {
                  sVar21 = psVar1[lVar37 * 0x18 + 5];
                  sVar25 = g->codes[0xfc5];
                  bVar11 = g->codes[0xfc4].prefix;
                  if (g->codes[0xfc3] == (stbi__gif_lzw)0x0) {
                    if (sVar25 == (stbi__gif_lzw)0x0) {
                      do {
                        if ((int)g->codes[0xfbd] < 0x10) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                        }
                        sVar47 = (&g->codes[(long)(int)sVar21 * 0x100 + 0xb56].prefix)
                                 [(uint)g->codes[0xfbc] >> 0x17];
                        uVar63 = (uint)sVar47;
                        iVar23 = (int)uVar46;
                        if (sVar47 == 0) {
                          uVar63 = stbi__jpeg_huff_decode
                                             ((stbi__jpeg *)g,
                                              (stbi__huffman *)
                                              (g->codes + (long)(int)sVar21 * 0x1a4 + 0x486));
                          if ((int)uVar63 < 0) goto LAB_0012dae9;
                          uVar30 = uVar63 >> 4;
                          if ((uVar63 & 0xf) == 0) {
                            if (uVar63 < 0xf0) {
                              sVar25 = (stbi__gif_lzw)(1 << ((byte)uVar30 & 0x1f));
                              g->codes[0xfc5] = sVar25;
                              if (0xf < uVar63) {
                                iVar23 = stbi__jpeg_get_bits((stbi__jpeg *)g,uVar30);
                                sVar25 = (stbi__gif_lzw)(iVar23 + (int)g->codes[0xfc5]);
                              }
                              goto LAB_0012cc13;
                            }
                            uVar46 = (ulong)(iVar23 + 0x10);
                          }
                          else {
                            lVar59 = (ulong)uVar30 + (long)iVar23;
                            uVar46 = (ulong)((int)lVar59 + 1);
                            bVar18 = ""[lVar59];
                            iVar23 = stbi__extend_receive((stbi__jpeg *)g,uVar63 & 0xf);
                            data_00[bVar18] = (short)(iVar23 << (bVar11 & 0x1f));
                          }
                        }
                        else {
                          lVar59 = (ulong)(uVar63 >> 4 & 0xf) + (long)iVar23;
                          g->codes[0xfbc] =
                               (stbi__gif_lzw)((int)g->codes[0xfbc] << (sbyte)(uVar63 & 0xf));
                          g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] - (uVar63 & 0xf));
                          uVar46 = (ulong)((int)lVar59 + 1);
                          data_00[""[lVar59]] = (short)((uVar63 >> 8) << (bVar11 & 0x1f));
                        }
                      } while ((int)uVar46 <= (int)g->codes[0xfc2]);
                    }
                    else {
LAB_0012cc13:
                      g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar25 + -1);
                    }
                  }
                  else if (sVar25 == (stbi__gif_lzw)0x0) {
                    iVar23 = 0x10000 << (bVar11 & 0x1f);
                    do {
                      uVar63 = stbi__jpeg_huff_decode
                                         ((stbi__jpeg *)g,
                                          (stbi__huffman *)
                                          (g->codes + (long)(int)sVar21 * 0x1a4 + 0x486));
                      if ((int)uVar63 < 0) goto LAB_0012dae9;
                      uVar30 = uVar63 >> 4;
                      if ((uVar63 & 0xf) == 1) {
                        iVar24 = stbi__jpeg_get_bit((stbi__jpeg *)g);
                        iVar32 = 1;
                        if (iVar24 == 0) {
                          iVar32 = 0xffff;
                        }
                        sVar47 = (short)(iVar32 << (bVar11 & 0x1f));
                      }
                      else {
                        if ((uVar63 & 0xf) != 0) {
                          stbi__g_failure_reason = "bad huffman code";
                          goto LAB_0012e565;
                        }
                        if (uVar63 < 0xf0) {
                          g->codes[0xfc5] = (stbi__gif_lzw)~(-1 << ((byte)uVar30 & 0x1f));
                          if (0xf < uVar63) {
                            iVar24 = stbi__jpeg_get_bits((stbi__jpeg *)g,uVar30);
                            g->codes[0xfc5] = (stbi__gif_lzw)((int)g->codes[0xfc5] + iVar24);
                          }
                          uVar30 = 0x40;
                        }
                        else {
                          uVar30 = 0xf;
                        }
                        sVar47 = 0;
                      }
                      uVar68 = (long)(int)uVar46;
                      do {
                        while( true ) {
                          uVar46 = uVar68;
                          sVar25 = g->codes[0xfc2];
                          if ((long)(int)sVar25 < (long)uVar46) goto LAB_0012cd43;
                          bVar18 = ""[uVar46];
                          if (data_00[bVar18] == 0) break;
                          iVar24 = stbi__jpeg_get_bit((stbi__jpeg *)g);
                          if ((iVar24 != 0) &&
                             (sVar5 = data_00[bVar18], (iVar23 >> 0x10 & (int)sVar5) == 0)) {
                            sVar8 = (short)((uint)iVar23 >> 0x10);
                            if (sVar5 < 1) {
                              sVar8 = -sVar8;
                            }
                            data_00[bVar18] = sVar5 + sVar8;
                          }
                          uVar68 = uVar46 + 1;
                        }
                        bVar70 = uVar30 != 0;
                        uVar30 = uVar30 - 1;
                        uVar68 = uVar46 + 1;
                      } while (bVar70);
                      data_00[bVar18] = sVar47;
                      uVar46 = uVar46 + 1;
LAB_0012cd43:
                    } while ((int)uVar46 <= (int)sVar25);
                  }
                  else {
                    g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar25 + -1);
                    uVar63 = (0x10000 << (bVar11 & 0x1f)) >> 0x10;
                    for (; (long)uVar46 <= (long)(int)g->codes[0xfc2]; uVar46 = uVar46 + 1) {
                      bVar11 = ""[uVar46];
                      if (((data_00[bVar11] != 0) &&
                          (iVar23 = stbi__jpeg_get_bit((stbi__jpeg *)g), iVar23 != 0)) &&
                         (sVar47 = data_00[bVar11], (uVar63 & (int)sVar47) == 0)) {
                        uVar30 = -uVar63;
                        if (0 < sVar47) {
                          uVar30 = uVar63;
                        }
                        data_00[bVar11] = (short)uVar30 + sVar47;
                      }
                    }
                  }
                }
                sVar21 = g->codes[0xfcd];
                g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar21 + -1);
                if ((int)sVar21 < 2) {
                  if ((int)g->codes[0xfbd] < 0x18) {
                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                  }
                  bVar11 = (byte)g->codes[0xfbe].prefix;
                  if ((bVar11 & 0xf8) != 0xd0) goto LAB_0012d311;
                  stbi__jpeg_reset((stbi__jpeg *)g);
                }
              }
            }
          }
          else {
            for (iVar19 = 0; iVar19 < (int)g->codes[0xf59]; iVar19 = iVar19 + 1) {
              for (iVar29 = 0; iVar29 < (int)g->codes[0xf58]; iVar29 = iVar29 + 1) {
                for (lVar37 = 0; lVar37 < (int)g->codes[0xfc7]; lVar37 = lVar37 + 1) {
                  sVar20 = g->codes[lVar37 + 0xfc8];
                  for (iVar57 = 0; iVar57 < (int)psVar1[(long)(int)sVar20 * 0x18 + 2];
                      iVar57 = iVar57 + 1) {
                    iVar45 = 0;
                    while (iVar45 < (int)psVar1[(long)(int)sVar20 * 0x18 + 1]) {
                      iVar23 = stbi__jpeg_decode_block_prog_dc
                                         ((stbi__jpeg *)g,
                                          (short *)(*(long *)(psVar1 + (long)(int)sVar20 * 0x18 +
                                                                       0x14) +
                                                   (long)(((int)psVar1[(long)(int)sVar20 * 0x18 + 1]
                                                           * iVar29 + iVar45 +
                                                          ((int)psVar1[(long)(int)sVar20 * 0x18 + 2]
                                                           * iVar19 + iVar57) *
                                                          (int)psVar1[(long)(int)sVar20 * 0x18 +
                                                                      0x16]) * 0x40) * 2),
                                          (stbi__huffman *)
                                          (g->pal + (long)(int)psVar1[(long)(int)sVar20 * 0x18 + 4]
                                                    * 0x1a4 + -10),(int)sVar20);
                      iVar45 = iVar45 + 1;
                      if (iVar23 == 0) goto LAB_0012e565;
                    }
                  }
                }
                sVar20 = g->codes[0xfcd];
                g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar20 + -1);
                if ((int)sVar20 < 2) {
                  if ((int)g->codes[0xfbd] < 0x18) {
                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                  }
                  bVar11 = (byte)g->codes[0xfbe].prefix;
                  if ((bVar11 & 0xf8) != 0xd0) goto LAB_0012d311;
                  stbi__jpeg_reset((stbi__jpeg *)g);
                }
              }
            }
          }
          bVar11 = (byte)g->codes[0xfbe].prefix;
LAB_0012d311:
          if (bVar11 != 0xff) goto LAB_0012c8cb;
          do {
            iVar19 = stbi__at_eof(*(stbi__context **)g);
            if (iVar19 != 0) goto LAB_0012c8cb;
            sVar12 = stbi__get8(*(stbi__context **)g);
          } while (sVar12 == '\0');
          if (sVar12 != 0xff) {
            stbi__g_failure_reason = "junk before marker";
            goto LAB_0012e565;
          }
          sVar12 = stbi__get8(*(stbi__context **)g);
          *(stbi_uc *)&g->codes[0xfbe].prefix = sVar12;
LAB_0012c8cb:
          bVar11 = stbi__get_marker((stbi__jpeg *)g);
        }
        if (bVar11 != 0xd9) {
          iVar19 = stbi__process_marker((stbi__jpeg *)g,(uint)bVar11);
          if (iVar19 != 0) goto LAB_0012c8cb;
          goto LAB_0012e565;
        }
        if (g->codes[0xfc0] == (stbi__gif_lzw)0x0) {
          puVar64 = *(uint **)g;
          uVar63 = puVar64[2];
        }
        else {
          lVar37 = 0;
          while( true ) {
            puVar64 = *(uint **)g;
            uVar63 = puVar64[2];
            if ((int)uVar63 <= lVar37) break;
            uVar63 = (int)g->codes[lVar37 * 0x18 + 0xf63] + 7 >> 3;
            iVar19 = (int)g->codes[lVar37 * 0x18 + 0xf64] + 7 >> 3;
            uVar68 = 0;
            uVar46 = (ulong)uVar63;
            if ((int)uVar63 < 1) {
              uVar46 = uVar68;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar29 = (int)uVar68, iVar29 != iVar19) {
              for (uVar68 = 0; uVar68 != uVar46; uVar68 = uVar68 + 1) {
                lVar59 = *(long *)(psVar1 + lVar37 * 0x18 + 0x14);
                sVar20 = psVar1[lVar37 * 0x18 + 0x16];
                sVar21 = psVar1[lVar37 * 0x18 + 3];
                iVar57 = (int)sVar20 * iVar29 + (int)uVar68;
                for (lVar60 = 0; lVar60 != 0x40; lVar60 = lVar60 + 1) {
                  *(ushort *)(lVar59 + (iVar57 * 0x40 + lVar60) * 2) =
                       (ushort)*(byte *)((long)&g->codes[(long)(int)sVar21 * 0x10 + 0xb16].prefix +
                                        lVar60) * *(short *)(lVar59 + (iVar57 * 0x40 + lVar60) * 2);
                }
                (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                          ((stbi_uc *)
                           (*(long *)(psVar1 + lVar37 * 0x18 + 0xc) +
                           uVar68 * 8 + (long)(iVar29 * 8 * (int)psVar1[lVar37 * 0x18 + 9])),
                           (int)psVar1[lVar37 * 0x18 + 9],
                           (short *)(lVar59 + (long)(((int)sVar20 * iVar29 + (int)uVar68) * 0x40) *
                                              2));
              }
              uVar68 = (ulong)(iVar29 + 1);
            }
            lVar37 = lVar37 + 1;
          }
        }
        if (req_comp == 0) {
          req_comp = uVar63;
        }
        lVar37 = 0;
        uVar46 = 0;
        if (0 < (int)uVar63) {
          uVar46 = (ulong)uVar63;
        }
        uVar68 = 1;
        if (2 < req_comp) {
          uVar68 = uVar46;
        }
        if (uVar63 != 3) {
          uVar68 = uVar46;
        }
        do {
          if (uVar68 * 0x30 == lVar37) {
            uVar63 = puVar64[1];
            psVar42 = (stbi__context *)malloc((ulong)(*puVar64 * req_comp * uVar63 + 1));
            if (psVar42 != (stbi__context *)0x0) {
              iVar19 = 0;
              for (uVar30 = 0; uVar30 < uVar63; uVar30 = uVar30 + 1) {
                uVar63 = *puVar64;
                ppsVar69 = coutput;
                for (lVar37 = 0; uVar68 * 0x30 != lVar37; lVar37 = lVar37 + 0x30) {
                  psVar52 = j.huff_dc[0].fast + lVar37 + 8;
                  iVar29 = *(int *)(j.huff_dc[0].fast + lVar37 + 0x1c);
                  iVar57 = *(int *)(j.huff_dc[0].fast + lVar37 + 0x14);
                  iVar45 = iVar57 >> 1;
                  psVar43 = j.huff_dc[0].fast + lVar37;
                  psVar39 = psVar52;
                  if (iVar29 < iVar45) {
                    psVar39 = psVar43;
                  }
                  if (iVar45 <= iVar29) {
                    psVar52 = psVar43;
                  }
                  psVar43 = (stbi_uc *)
                            (**(code **)(j.huff_dc[0].fast + lVar37 + -8))
                                      (*(undefined8 *)((long)&g->codes[0xf6e].prefix + lVar37 * 2),
                                       *(undefined8 *)psVar39,*(undefined8 *)psVar52,
                                       *(undefined4 *)(j.huff_dc[0].fast + lVar37 + 0x18),
                                       *(undefined4 *)(j.huff_dc[0].fast + lVar37 + 0x10));
                  *ppsVar69 = psVar43;
                  *(int *)(j.huff_dc[0].fast + lVar37 + 0x1c) = iVar29 + 1;
                  if (iVar57 <= iVar29 + 1) {
                    psVar43 = j.huff_dc[0].fast + lVar37 + 0x1c;
                    psVar43[0] = '\0';
                    psVar43[1] = '\0';
                    psVar43[2] = '\0';
                    psVar43[3] = '\0';
                    lVar59 = *(long *)(j.huff_dc[0].fast + lVar37 + 8);
                    *(long *)(j.huff_dc[0].fast + lVar37) = lVar59;
                    iVar29 = *(int *)(j.huff_dc[0].fast + lVar37 + 0x20) + 1;
                    *(int *)(j.huff_dc[0].fast + lVar37 + 0x20) = iVar29;
                    if (iVar29 < *(int *)((long)&g->codes[0xf64].prefix + lVar37 * 2)) {
                      *(long *)(j.huff_dc[0].fast + lVar37 + 8) =
                           lVar59 + *(int *)((long)&g->codes[0xf65].prefix + lVar37 * 2);
                    }
                  }
                  ppsVar69 = ppsVar69 + 1;
                }
                psVar43 = (stbi_uc *)CONCAT44(coutput[0]._4_4_,(int)coutput[0]);
                puVar64 = *(uint **)g;
                if (req_comp < 3) {
                  if (req_comp == 1) {
                    for (uVar46 = 0; uVar46 < *puVar64; uVar46 = uVar46 + 1) {
                      psVar42->buffer_start[uVar46 + uVar63 * iVar19 + -0x38] = psVar43[uVar46];
                    }
                  }
                  else {
                    for (uVar46 = 0; uVar46 < *puVar64; uVar46 = uVar46 + 1) {
                      psVar42->buffer_start[uVar46 * 2 + (ulong)(uVar63 * iVar19) + -0x38] =
                           psVar43[uVar46];
                      psVar42->buffer_start[uVar46 * 2 + (ulong)(uVar63 * iVar19) + -0x37] = 0xff;
                    }
                  }
                }
                else if (puVar64[2] == 3) {
                  if (g->codes[0xfc6] == (stbi__gif_lzw)0x3) {
                    psVar52 = psVar42->buffer_start + ((ulong)(uVar63 * iVar19) - 0x35);
                    for (uVar46 = 0; uVar46 < *puVar64; uVar46 = uVar46 + 1) {
                      psVar52[-3] = psVar43[uVar46];
                      psVar52[-2] = *(undefined1 *)
                                     (CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar46);
                      psVar52[-1] = *(undefined1 *)
                                     (CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) + uVar46);
                      *psVar52 = 0xff;
                      psVar52 = psVar52 + (uint)req_comp;
                    }
                  }
                  else {
                    (**(_func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int **)
                       (g->codes + 0xfd0))
                              (psVar42->buffer_start + ((ulong)(uVar30 * req_comp * uVar63) - 0x38),
                               psVar43,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                               (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),*puVar64,
                               req_comp);
                    puVar64 = *(uint **)g;
                  }
                }
                else {
                  psVar52 = psVar42->buffer_start + ((ulong)(uVar63 * iVar19) - 0x35);
                  for (uVar46 = 0; uVar46 < *puVar64; uVar46 = uVar46 + 1) {
                    sVar12 = psVar43[uVar46];
                    psVar52[-1] = sVar12;
                    psVar52[-2] = sVar12;
                    psVar52[-3] = sVar12;
                    *psVar52 = 0xff;
                    psVar52 = psVar52 + (uint)req_comp;
                  }
                }
                uVar63 = puVar64[1];
                iVar19 = iVar19 + req_comp;
              }
              stbi__cleanup_jpeg((stbi__jpeg *)g);
              piVar7 = *(int **)g;
              *x = *piVar7;
              *y = piVar7[1];
              if (comp != (int *)0x0) {
                *comp = piVar7[2];
              }
              goto LAB_0012e574;
            }
            stbi__cleanup_jpeg((stbi__jpeg *)g);
LAB_0012eacd:
            stbi__g_failure_reason = "outofmem";
            goto LAB_0012e572;
          }
          uVar63 = *puVar64;
          pvVar40 = malloc((ulong)(uVar63 + 3));
          *(void **)((long)&g->codes[0xf6e].prefix + lVar37 * 2) = pvVar40;
          if (pvVar40 == (void *)0x0) {
            stbi__cleanup_jpeg((stbi__jpeg *)g);
            goto LAB_0012eacd;
          }
          uVar46 = (long)(int)g->codes[0xf56] /
                   (long)*(int *)((long)&g->codes[0xf5d].prefix + lVar37 * 2);
          iVar19 = (int)uVar46;
          *(int *)(j.huff_dc[0].fast + lVar37 + 0x10) = iVar19;
          iVar29 = (int)g->codes[0xf57] / *(int *)((long)&g->codes[0xf5e].prefix + lVar37 * 2);
          *(int *)(j.huff_dc[0].fast + lVar37 + 0x14) = iVar29;
          *(int *)(j.huff_dc[0].fast + lVar37 + 0x1c) = iVar29 >> 1;
          *(int *)(j.huff_dc[0].fast + lVar37 + 0x18) =
               (int)((ulong)((uVar63 + iVar19) - 1) / (uVar46 & 0xffffffff));
          psVar43 = j.huff_dc[0].fast + lVar37 + 0x20;
          psVar43[0] = '\0';
          psVar43[1] = '\0';
          psVar43[2] = '\0';
          psVar43[3] = '\0';
          uVar6 = *(undefined8 *)((long)&g->codes[0xf68].prefix + lVar37 * 2);
          *(undefined8 *)(j.huff_dc[0].fast + lVar37 + 8) = uVar6;
          *(undefined8 *)(j.huff_dc[0].fast + lVar37) = uVar6;
          if (iVar19 == 2) {
            pcVar41 = stbi__resample_row_h_2;
            if (iVar29 != 1) {
              if (iVar29 != 2) goto LAB_0012e2a8;
              pcVar41 = *(code **)(g->codes + 0xfd2);
            }
          }
          else if (iVar19 == 1) {
            pcVar41 = stbi__resample_row_generic;
            if (iVar29 == 2) {
              pcVar41 = stbi__resample_row_v_2;
            }
            if (iVar29 == 1) {
              pcVar41 = resample_row_1;
            }
          }
          else {
LAB_0012e2a8:
            pcVar41 = stbi__resample_row_generic;
          }
          *(code **)(j.huff_dc[0].fast + lVar37 + -8) = pcVar41;
          lVar37 = lVar37 + 0x30;
        } while( true );
      }
LAB_0012e565:
      stbi__cleanup_jpeg((stbi__jpeg *)g);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0012e572:
    psVar42 = (stbi__context *)0x0;
    goto LAB_0012e574;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (uchar *)0x0;
    }
    j.s = s;
    iVar19 = stbi__parse_png_file((stbi__png *)&j,0,req_comp);
    psVar9 = j.s;
    if (iVar19 == 0) {
      psVar42 = (stbi__context *)0x0;
    }
    else {
      psVar42 = (stbi__context *)j.huff_dc[0].fast._16_8_;
      if (j.huff_dc[0].fast._24_4_ == 0x10) {
        uVar63 = (j.s)->img_x * (j.s)->img_y * (j.s)->img_out_n;
        psVar42 = (stbi__context *)malloc((long)(int)uVar63);
        uVar68 = 0;
        uVar46 = (ulong)uVar63;
        if ((int)uVar63 < 1) {
          uVar46 = uVar68;
        }
        for (; uVar46 != uVar68; uVar68 = uVar68 + 1) {
          psVar42->buffer_start[uVar68 - 0x38] =
               *(stbi_uc *)(j.huff_dc[0].fast._16_8_ + 1 + uVar68 * 2);
        }
        free((void *)j.huff_dc[0].fast._16_8_);
      }
      if ((req_comp != 0) && (psVar9->img_out_n != req_comp)) {
        psVar42 = (stbi__context *)
                  stbi__convert_format
                            ((uchar *)psVar42,psVar9->img_out_n,req_comp,psVar9->img_x,psVar9->img_y
                            );
        psVar9->img_out_n = req_comp;
        if (psVar42 == (stbi__context *)0x0) {
          return (uchar *)0x0;
        }
      }
      *x = psVar9->img_x;
      *y = psVar9->img_y;
      if (comp != (int *)0x0) {
        *comp = psVar9->img_n;
      }
      j.huff_dc[0].fast._16_8_ = (void *)0x0;
    }
    free((void *)j.huff_dc[0].fast._16_8_);
    free((void *)j.huff_dc[0].fast._8_8_);
    g = (stbi__gif *)j.huff_dc[0].fast._0_8_;
    goto LAB_0012e574;
  }
  sVar12 = stbi__get8(s);
  if ((sVar12 == 'B') && (sVar12 = stbi__get8(s), sVar12 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar26 = stbi__get32le(s);
    if (((sVar26 < 0x39) && ((0x100010000001000U >> ((ulong)sVar26 & 0x3f) & 1) != 0)) ||
       ((sVar26 == 0x7c || (sVar26 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3]._4_4_ = 0xff;
      pvVar40 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar40 == (void *)0x0) {
        return (uchar *)0x0;
      }
      sVar26 = s->img_y;
      sVar27 = -sVar26;
      if (0 < (int)sVar26) {
        sVar27 = sVar26;
      }
      s->img_y = sVar27;
      local_4890 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          uVar46 = (long)(coutput[0]._4_4_ + -0x26) / 3 & 0xffffffff;
        }
        else {
LAB_0012da53:
          uVar46 = 0;
        }
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_0012da53;
        uVar46 = (ulong)(uint)((coutput[0]._4_4_ - (int)coutput[1]) + -0xe >> 2);
      }
      iVar19 = 4 - (uint)((uint)coutput[3] == 0);
      s->img_n = iVar19;
      if (2 < req_comp) {
        iVar19 = req_comp;
      }
      puVar38 = (uchar *)malloc((ulong)(sVar27 * iVar19 * s->img_x));
      if (puVar38 == (uchar *)0x0) goto LAB_0012e05f;
      if ((int)coutput[0] < 0x10) {
        iVar29 = (int)uVar46;
        if (0x100 < iVar29 || iVar29 == 0) {
          free(puVar38);
          stbi__g_failure_reason = "invalid";
          return (uchar *)0x0;
        }
        uVar67 = 0;
        uVar68 = 0;
        if (0 < iVar29) {
          uVar68 = uVar46;
        }
        for (; uVar68 != uVar67; uVar67 = uVar67 + 1) {
          sVar12 = stbi__get8(s);
          j.huff_dc[0].fast[uVar67 * 4 + -6] = sVar12;
          sVar12 = stbi__get8(s);
          j.huff_dc[0].fast[uVar67 * 4 + -7] = sVar12;
          sVar12 = stbi__get8(s);
          j.huff_dc[0].fast[uVar67 * 4 + -8] = sVar12;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          j.huff_dc[0].fast[uVar67 * 4 + -5] = 0xff;
        }
        stbi__skip(s,(iVar29 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if ((int)coutput[0] == 8) {
          uVar63 = s->img_x;
        }
        else {
          if ((int)coutput[0] != 4) {
            free(puVar38);
            stbi__g_failure_reason = "bad bpp";
            return (uchar *)0x0;
          }
          uVar63 = s->img_x + 1 >> 1;
        }
        uVar46 = 0;
        for (iVar29 = 0; sVar27 = s->img_y, iVar29 < (int)sVar27; iVar29 = iVar29 + 1) {
          for (iVar57 = 0; iVar57 < (int)s->img_x; iVar57 = iVar57 + 2) {
            bVar11 = stbi__get8(s);
            uVar30 = (uint)(bVar11 >> 4);
            if ((int)coutput[0] != 4) {
              uVar30 = (uint)bVar11;
            }
            uVar68 = (ulong)uVar30;
            uVar30 = bVar11 & 0xf;
            if ((int)coutput[0] != 4) {
              uVar30 = 0;
            }
            lVar37 = (long)(int)uVar46;
            uVar67 = lVar37 + 3;
            puVar38[lVar37] = j.huff_dc[0].fast[uVar68 * 4 + -8];
            puVar38[lVar37 + 1] = j.huff_dc[0].fast[uVar68 * 4 + -7];
            puVar38[lVar37 + 2] = j.huff_dc[0].fast[uVar68 * 4 + -6];
            if (iVar19 == 4) {
              puVar38[lVar37 + 3] = 0xff;
              uVar67 = (ulong)((int)uVar46 + 4);
            }
            if (iVar57 + 1U == s->img_x) {
              uVar46 = uVar67 & 0xffffffff;
              break;
            }
            if ((int)coutput[0] == 8) {
              bVar11 = stbi__get8(s);
              uVar30 = (uint)bVar11;
            }
            lVar37 = (long)(int)uVar67;
            uVar46 = lVar37 + 3;
            uVar68 = (ulong)uVar30;
            puVar38[lVar37] = j.huff_dc[0].fast[uVar68 * 4 + -8];
            puVar38[lVar37 + 1] = j.huff_dc[0].fast[uVar68 * 4 + -7];
            puVar38[lVar37 + 2] = j.huff_dc[0].fast[uVar68 * 4 + -6];
            if (iVar19 == 4) {
              puVar38[lVar37 + 3] = 0xff;
              uVar46 = (ulong)((int)uVar67 + 4);
            }
          }
          stbi__skip(s,-uVar63 & 3);
        }
        goto LAB_0012e95a;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if ((int)coutput[0] == 0x10) {
        local_4804 = s->img_x * 2 & 2;
LAB_0012e71a:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar38);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        iVar29 = stbi__high_bit(coutput[1]._4_4_);
        iVar29 = iVar29 + -7;
        iVar57 = stbi__bitcount(coutput[1]._4_4_);
        iVar45 = stbi__high_bit((uint)coutput[2]);
        iVar45 = iVar45 + -7;
        iVar23 = stbi__bitcount((uint)coutput[2]);
        iVar24 = stbi__high_bit(coutput[2]._4_4_);
        iVar24 = iVar24 + -7;
        local_47f4 = stbi__bitcount(coutput[2]._4_4_);
        local_47f8 = stbi__high_bit((uint)coutput[3]);
        local_47f8 = local_47f8 + -7;
        local_47fc = stbi__bitcount((uint)coutput[3]);
        bVar17 = true;
        bVar70 = false;
      }
      else {
        if ((int)coutput[0] == 0x20) {
          local_4804 = 0;
          if ((uint)coutput[3] != 0xff000000 ||
              (coutput[1]._4_4_ != 0xff0000 ||
              ((uint)coutput[2] != 0xff00 || coutput[2]._4_4_ != 0xff))) goto LAB_0012e71a;
          bVar70 = true;
        }
        else {
          local_4804 = 0;
          if ((int)coutput[0] != 0x18) goto LAB_0012e71a;
          local_4804 = s->img_x & 3;
          bVar70 = false;
        }
        bVar17 = false;
        iVar29 = 0;
        iVar45 = 0;
        iVar24 = 0;
        local_47f8 = 0;
        iVar57 = 0;
        iVar23 = 0;
        local_47f4 = 0;
        local_47fc = 0;
      }
      iVar50 = 0;
      for (iVar32 = 0; sVar27 = s->img_y, iVar32 < (int)sVar27; iVar32 = iVar32 + 1) {
        if (bVar17) {
          for (iVar66 = 0; iVar66 < (int)s->img_x; iVar66 = iVar66 + 1) {
            if ((int)coutput[0] == 0x10) {
              uVar63 = stbi__get16le(s);
            }
            else {
              uVar63 = stbi__get32le(s);
            }
            iVar31 = stbi__shiftsigned(uVar63 & coutput[1]._4_4_,iVar29,iVar57);
            puVar38[iVar50] = (uchar)iVar31;
            iVar31 = stbi__shiftsigned(uVar63 & (uint)coutput[2],iVar45,iVar23);
            puVar38[(long)iVar50 + 1] = (uchar)iVar31;
            iVar31 = stbi__shiftsigned(uVar63 & coutput[2]._4_4_,iVar24,local_47f4);
            puVar38[(long)iVar50 + 2] = (uchar)iVar31;
            if ((uint)coutput[3] == 0) {
              uVar63 = 0xff;
            }
            else {
              uVar63 = stbi__shiftsigned(uVar63 & (uint)coutput[3],local_47f8,local_47fc);
            }
            iVar31 = iVar50 + 3;
            if (iVar19 == 4) {
              puVar38[(long)iVar50 + 3] = (uchar)uVar63;
              iVar31 = iVar50 + 4;
            }
            iVar50 = iVar31;
            local_4890 = local_4890 | uVar63;
          }
        }
        else {
          for (iVar66 = 0; iVar66 < (int)s->img_x; iVar66 = iVar66 + 1) {
            sVar12 = stbi__get8(s);
            puVar38[(long)iVar50 + 2] = sVar12;
            sVar12 = stbi__get8(s);
            puVar38[(long)iVar50 + 1] = sVar12;
            sVar12 = stbi__get8(s);
            puVar38[iVar50] = sVar12;
            bVar11 = 0xff;
            if (bVar70) {
              bVar11 = stbi__get8(s);
            }
            iVar31 = iVar50 + 3;
            if (iVar19 == 4) {
              puVar38[(long)iVar50 + 3] = bVar11;
              iVar31 = iVar50 + 4;
            }
            iVar50 = iVar31;
            local_4890 = local_4890 | bVar11;
          }
        }
        stbi__skip(s,local_4804);
      }
LAB_0012e95a:
      if ((iVar19 == 4) && (local_4890 == 0)) {
        for (uVar63 = s->img_x * sVar27 * 4 - 1; -1 < (int)uVar63; uVar63 = uVar63 - 4) {
          puVar38[uVar63] = 0xff;
        }
      }
      if (0 < (int)sVar26) {
        iVar29 = (int)sVar27 >> 1;
        if ((int)sVar27 >> 1 < 1) {
          iVar29 = 0;
        }
        iVar23 = (sVar27 - 1) * iVar19;
        iVar57 = 0;
        for (iVar45 = 0; iVar45 != iVar29; iVar45 = iVar45 + 1) {
          sVar26 = s->img_x;
          uVar46 = (ulong)(sVar26 * iVar19);
          if ((int)(sVar26 * iVar19) < 1) {
            uVar46 = 0;
          }
          for (uVar68 = 0; uVar46 != uVar68; uVar68 = uVar68 + 1) {
            uVar3 = puVar38[uVar68 + sVar26 * iVar57];
            puVar38[uVar68 + sVar26 * iVar57] = puVar38[uVar68 + sVar26 * iVar23];
            puVar38[uVar68 + sVar26 * iVar23] = uVar3;
          }
          iVar23 = iVar23 - iVar19;
          iVar57 = iVar57 + iVar19;
        }
      }
      uVar63 = s->img_x;
      if ((req_comp != 0) && (iVar19 != req_comp)) {
        puVar38 = stbi__convert_format(puVar38,iVar19,req_comp,uVar63,sVar27);
        if (puVar38 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
        uVar63 = s->img_x;
      }
      *x = uVar63;
      *y = s->img_y;
      if (comp == (int *)0x0) {
        return puVar38;
      }
      *comp = s->img_n;
      return puVar38;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar12 = stbi__get8(s);
  if ((((sVar12 != 'G') || (sVar12 = stbi__get8(s), sVar12 != 'I')) ||
      (sVar12 = stbi__get8(s), sVar12 != 'F')) ||
     ((sVar12 = stbi__get8(s), sVar12 != '8' ||
      ((sVar12 = stbi__get8(s), sVar12 != '9' && (sVar12 != '7')))))) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0012d61b:
    sVar26 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar26 == 0x38425053) {
      sVar26 = stbi__get32be(s);
      if (sVar26 != 0x38425053) {
        stbi__g_failure_reason = "not PSD";
        return (uchar *)0x0;
      }
      iVar19 = stbi__get16be(s);
      if (iVar19 != 1) {
        stbi__g_failure_reason = "wrong version";
        return (uchar *)0x0;
      }
      stbi__skip(s,6);
      uVar63 = stbi__get16be(s);
      if (0x10 < uVar63) {
        stbi__g_failure_reason = "wrong channel count";
        return (uchar *)0x0;
      }
      sVar26 = stbi__get32be(s);
      sVar27 = stbi__get32be(s);
      iVar19 = stbi__get16be(s);
      if ((iVar19 != 8) && (iVar19 != 0x10)) {
        stbi__g_failure_reason = "unsupported bit depth";
        return (uchar *)0x0;
      }
      iVar29 = stbi__get16be(s);
      if (iVar29 != 3) {
        stbi__g_failure_reason = "wrong color format";
        return (uchar *)0x0;
      }
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      uVar30 = stbi__get16be(s);
      if (1 < uVar30) {
        stbi__g_failure_reason = "bad compression";
        return (uchar *)0x0;
      }
      uVar33 = sVar26 * sVar27;
      puVar38 = (uchar *)malloc((long)(int)(uVar33 * 4));
      if (puVar38 != (uchar *)0x0) {
        if (uVar30 == 0) {
          uVar46 = 0;
          uVar30 = 0;
          if (0 < (int)uVar33) {
            uVar30 = uVar33;
          }
          puVar53 = puVar38;
          for (; uVar46 != 4; uVar46 = uVar46 + 1) {
            if (uVar46 < uVar63) {
              lVar37 = 0;
              if (iVar19 == 0x10) {
                for (; uVar30 != (uint)lVar37; lVar37 = lVar37 + 1) {
                  iVar29 = stbi__get16be(s);
                  puVar53[lVar37 * 4] = (uchar)((uint)iVar29 >> 8);
                }
              }
              else {
                for (; uVar30 != (uint)lVar37; lVar37 = lVar37 + 1) {
                  sVar12 = stbi__get8(s);
                  puVar53[lVar37 * 4] = sVar12;
                }
              }
            }
            else {
              for (lVar37 = 0; uVar30 != (uint)lVar37; lVar37 = lVar37 + 1) {
                puVar53[lVar37 * 4] = -(uVar46 == 3);
              }
            }
            puVar53 = puVar53 + 1;
          }
        }
        else {
          stbi__skip(s,uVar63 * sVar26 * 2);
          uVar46 = 0;
          uVar30 = 0;
          if (0 < (int)uVar33) {
            uVar30 = uVar33;
          }
          puVar53 = puVar38;
          for (; uVar46 != 4; uVar46 = uVar46 + 1) {
            if (uVar46 < uVar63) {
              psVar43 = puVar38 + uVar46;
              iVar19 = 0;
              while (iVar19 < (int)uVar33) {
                bVar11 = stbi__get8(s);
                if (bVar11 != 0x80) {
                  if ((char)bVar11 < '\0') {
                    iVar29 = 0x101 - (uint)bVar11;
                    sVar12 = stbi__get8(s);
                    for (iVar57 = bVar11 - 0x101; iVar57 != 0; iVar57 = iVar57 + 1) {
                      *psVar43 = sVar12;
                      psVar43 = psVar43 + 4;
                    }
                  }
                  else {
                    iVar29 = bVar11 + 1;
                    iVar57 = iVar29;
                    while (bVar70 = iVar57 != 0, iVar57 = iVar57 + -1, bVar70) {
                      sVar12 = stbi__get8(s);
                      *psVar43 = sVar12;
                      psVar43 = psVar43 + 4;
                    }
                  }
                  iVar19 = iVar19 + iVar29;
                }
              }
            }
            else {
              for (lVar37 = 0; uVar30 != (uint)lVar37; lVar37 = lVar37 + 1) {
                puVar53[lVar37 * 4] = -(uVar46 == 3);
              }
            }
            puVar53 = puVar53 + 1;
          }
        }
        if (3 < uVar63) {
          uVar68 = 0;
          uVar46 = (ulong)uVar33;
          if ((int)uVar33 < 1) {
            uVar46 = uVar68;
          }
          for (; uVar46 != uVar68; uVar68 = uVar68 + 1) {
            bVar11 = puVar38[uVar68 * 4 + 3];
            if ((bVar11 != 0) && (bVar11 != 0xff)) {
              fVar72 = 1.0 / ((float)bVar11 / 255.0);
              fVar71 = (1.0 - fVar72) * 255.0;
              puVar38[uVar68 * 4] = (uchar)(int)((float)puVar38[uVar68 * 4] * fVar72 + fVar71);
              puVar38[uVar68 * 4 + 1] =
                   (uchar)(int)((float)puVar38[uVar68 * 4 + 1] * fVar72 + fVar71);
              puVar38[uVar68 * 4 + 2] =
                   (uchar)(int)((float)puVar38[uVar68 * 4 + 2] * fVar72 + fVar71);
            }
          }
        }
        if (((req_comp & 0xfffffffbU) != 0) &&
           (puVar38 = stbi__convert_format(puVar38,4,req_comp,sVar27,sVar26),
           puVar38 == (uchar *)0x0)) {
          return (uchar *)0x0;
        }
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        *y = sVar26;
        *x = sVar27;
        return puVar38;
      }
      goto LAB_0012e05f;
    }
    iVar19 = 4;
    iVar29 = stbi__pic_is4(s,anon_var_dwarf_424bf);
    if (iVar29 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0012d7ef:
      sVar12 = stbi__get8(s);
      sVar13 = stbi__get8(s);
      if ((sVar12 == 'P') && (0xfd < (byte)(sVar13 - 0x37))) {
        iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
        if (iVar19 == 0) {
          return (uchar *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        iVar19 = s->img_n;
        *comp = iVar19;
        uVar63 = iVar19 * s->img_x * s->img_y;
        puVar38 = (uchar *)malloc((ulong)uVar63);
        if (puVar38 != (uchar *)0x0) {
          stbi__getn(s,puVar38,uVar63);
          if (req_comp == 0) {
            return puVar38;
          }
          iVar19 = s->img_n;
          if (iVar19 == req_comp) {
            return puVar38;
          }
          puVar38 = stbi__convert_format(puVar38,iVar19,req_comp,s->img_x,s->img_y);
          return puVar38;
        }
        goto LAB_0012e05f;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar29 = stbi__hdr_test(s);
      if (iVar29 != 0) {
        data = stbi__hdr_load(s,x,y,comp,req_comp);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        uVar63 = *y * *x;
        puVar38 = (uchar *)malloc((long)(int)(req_comp * uVar63));
        if (puVar38 != (uchar *)0x0) {
          uVar30 = (req_comp + (req_comp & 1U)) - 1;
          uVar68 = 0;
          uVar46 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar46 = uVar68;
          }
          lVar37 = (long)req_comp;
          puVar53 = puVar38;
          pfVar62 = data;
          uVar67 = (ulong)uVar63;
          if ((int)uVar63 < 1) {
            uVar67 = uVar68;
          }
          for (; uVar68 != uVar67; uVar68 = uVar68 + 1) {
            for (uVar51 = 0; uVar46 != uVar51; uVar51 = uVar51 + 1) {
              fVar71 = powf(pfVar62[uVar51] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar72 = fVar71 * 255.0 + 0.5;
              fVar71 = 0.0;
              if (0.0 <= fVar72) {
                fVar71 = fVar72;
              }
              fVar72 = 255.0;
              if (fVar71 <= 255.0) {
                fVar72 = fVar71;
              }
              puVar53[uVar51] = (uchar)(int)fVar72;
            }
            if ((int)uVar46 < req_comp) {
              lVar59 = uVar68 * lVar37 + uVar46;
              fVar72 = data[lVar59] * 255.0 + 0.5;
              fVar71 = 0.0;
              if (0.0 <= fVar72) {
                fVar71 = fVar72;
              }
              fVar72 = 255.0;
              if (fVar71 <= 255.0) {
                fVar72 = fVar71;
              }
              puVar38[lVar59] = (uchar)(int)fVar72;
            }
            puVar53 = puVar53 + lVar37;
            pfVar62 = pfVar62 + lVar37;
          }
          free(data);
          return puVar38;
        }
LAB_0012e05a:
        free(data);
LAB_0012e05f:
        stbi__g_failure_reason = "outofmem";
        return (uchar *)0x0;
      }
      stbi__get8(s);
      bVar11 = stbi__get8(s);
      if (bVar11 < 2) {
        bVar18 = stbi__get8(s);
        if (bVar11 == 1) {
          if ((bVar18 & 0xf7) == 1) {
            stbi__skip(s,4);
            bVar18 = stbi__get8(s);
            if ((bVar18 < 0x21) && ((0x101018100U >> ((ulong)bVar18 & 0x3f) & 1) != 0))
            goto LAB_0012e601;
          }
        }
        else if ((bVar18 & 0xf6) == 2) {
          iVar19 = 9;
LAB_0012e601:
          stbi__skip(s,iVar19);
          iVar19 = stbi__get16le(s);
          if ((iVar19 != 0) && (iVar19 = stbi__get16le(s), iVar19 != 0)) {
            bVar18 = stbi__get8(s);
            if (bVar11 == 1) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              if ((bVar18 - 8 & 0xf7) != 0) goto LAB_0012dcce;
            }
            else {
              if ((0x20 < bVar18) || ((0x101018100U >> ((ulong)bVar18 & 0x3f) & 1) == 0))
              goto LAB_0012dcbe;
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
            }
            bVar18 = stbi__get8(s);
            sVar12 = stbi__get8(s);
            bVar14 = stbi__get8(s);
            iVar19 = stbi__get16le(s);
            uVar33 = stbi__get16le(s);
            bVar11 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar63 = stbi__get16le(s);
            uVar30 = stbi__get16le(s);
            bVar15 = stbi__get8(s);
            j.s = (stbi__context *)((ulong)j.s & 0xffffffff00000000);
            bVar16 = stbi__get8(s);
            if (sVar12 == '\0') {
              uVar34 = bVar14 - 8;
              if (bVar14 < 8) {
                uVar34 = (uint)bVar14;
              }
              uVar34 = (uint)(uVar34 == 3);
              bVar11 = bVar15;
            }
            else {
              uVar34 = 0;
            }
            uVar34 = stbi__tga_get_comp((uint)bVar11,uVar34,(int *)&j);
            if (uVar34 == 0) {
              stbi__g_failure_reason = "bad format";
              return (uchar *)0x0;
            }
            *x = uVar63;
            *y = uVar30;
            if (comp != (int *)0x0) {
              *comp = uVar34;
            }
            uVar68 = (ulong)(uVar30 * uVar63);
            uVar46 = (ulong)uVar34;
            data = (float *)malloc(uVar46 * uVar68);
            if (data == (float *)0x0) goto LAB_0012e05f;
            stbi__skip(s,(uint)bVar18);
            if (((sVar12 == '\0') && (bVar14 < 8)) && ((int)j.s == 0)) {
              uVar54 = 0;
              uVar33 = uVar30;
              while (uVar33 = uVar33 - 1, uVar33 != 0xffffffff) {
                uVar35 = uVar54;
                if ((bVar16 >> 5 & 1) == 0) {
                  uVar35 = uVar33;
                }
                stbi__getn(s,(stbi_uc *)((long)data + (long)(int)(uVar35 * uVar63 * uVar34)),
                           uVar63 * uVar34);
                uVar54 = uVar54 + 1;
              }
            }
            else {
              if (sVar12 == '\0') {
                local_4848 = (stbi_uc *)0x0;
              }
              else {
                stbi__skip(s,iVar19);
                local_4848 = (stbi_uc *)malloc((ulong)(uVar34 * uVar33));
                if (local_4848 == (stbi_uc *)0x0) goto LAB_0012e05a;
                if ((int)j.s == 0) {
                  iVar19 = stbi__getn(s,local_4848,uVar34 * uVar33);
                  if (iVar19 == 0) {
                    free(data);
                    free(local_4848);
                    stbi__g_failure_reason = "bad palette";
                    return (uchar *)0x0;
                  }
                }
                else {
                  psVar43 = local_4848;
                  uVar54 = uVar33;
                  if (uVar34 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                                  ,0x1434,
                                  "stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)"
                                 );
                  }
                  while (uVar54 != 0) {
                    stbi__tga_read_rgb16(s,psVar43);
                    psVar43 = psVar43 + uVar46;
                    uVar54 = uVar54 - 1;
                  }
                }
              }
              bVar17 = true;
              iVar19 = 0;
              bVar70 = false;
              pfVar62 = data;
              for (uVar67 = 0; uVar67 != uVar68; uVar67 = uVar67 + 1) {
                if (bVar14 < 8) {
LAB_0012f444:
                  if (sVar12 == '\0') {
                    if ((int)j.s == 0) {
                      for (uVar51 = 0; uVar46 != uVar51; uVar51 = uVar51 + 1) {
                        sVar13 = stbi__get8(s);
                        *(stbi_uc *)((long)coutput + uVar51) = sVar13;
                      }
                    }
                    else {
                      if (uVar34 != 3) {
                        __assert_fail("tga_comp == STBI_rgb",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                                      ,0x1465,
                                      "stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)"
                                     );
                      }
                      stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                    }
                  }
                  else {
                    if (bVar15 == 8) {
                      bVar11 = stbi__get8(s);
                      uVar54 = (uint)bVar11;
                    }
                    else {
                      uVar54 = stbi__get16le(s);
                    }
                    if (uVar33 <= uVar54) {
                      uVar54 = 0;
                    }
                    for (uVar51 = 0; uVar46 != uVar51; uVar51 = uVar51 + 1) {
                      *(stbi_uc *)((long)coutput + uVar51) = local_4848[uVar51 + uVar54 * uVar34];
                    }
                  }
                }
                else {
                  if (iVar19 == 0) {
                    bVar11 = stbi__get8(s);
                    iVar19 = (bVar11 & 0x7f) + 1;
                    bVar70 = (bool)(bVar11 >> 7);
                    goto LAB_0012f444;
                  }
                  bVar70 = bVar70 != false;
                  if (!bVar70 || bVar17) goto LAB_0012f444;
                  bVar70 = true;
                }
                for (uVar51 = 0; uVar46 != uVar51; uVar51 = uVar51 + 1) {
                  *(undefined1 *)((long)pfVar62 + uVar51) = *(undefined1 *)((long)coutput + uVar51);
                }
                iVar19 = iVar19 + -1;
                pfVar62 = (float *)((long)pfVar62 + uVar46);
                bVar17 = false;
              }
              if ((bVar16 >> 5 & 1) == 0) {
                iVar19 = uVar63 * uVar34;
                iVar29 = (uVar30 - 1) * iVar19;
                uVar33 = 0;
                for (uVar54 = 0; uVar54 != uVar30 + 1 >> 1; uVar54 = uVar54 + 1) {
                  pfVar62 = data;
                  for (iVar57 = iVar19; 0 < iVar57; iVar57 = iVar57 + -1) {
                    uVar4 = *(undefined1 *)((long)pfVar62 + (ulong)uVar33);
                    *(undefined1 *)((long)pfVar62 + (ulong)uVar33) =
                         *(undefined1 *)((long)pfVar62 + (long)iVar29);
                    *(undefined1 *)((long)pfVar62 + (long)iVar29) = uVar4;
                    pfVar62 = (float *)((long)pfVar62 + 1);
                  }
                  uVar33 = uVar33 + iVar19;
                  iVar29 = iVar29 - iVar19;
                }
              }
              free(local_4848);
            }
            if ((2 < uVar34) && ((int)j.s == 0)) {
              puVar44 = (undefined1 *)((long)data + 2);
              while (iVar19 = (int)uVar68, uVar68 = (ulong)(iVar19 - 1), iVar19 != 0) {
                uVar4 = puVar44[-2];
                puVar44[-2] = *puVar44;
                *puVar44 = uVar4;
                puVar44 = puVar44 + uVar46;
              }
            }
            if (req_comp == 0) {
              return (uchar *)data;
            }
            if (uVar34 == req_comp) {
              return (uchar *)data;
            }
            goto LAB_0012eab0;
          }
        }
      }
LAB_0012dcbe:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0012dcce:
      stbi__g_failure_reason = "unknown image type";
      return (uchar *)0x0;
    }
    iVar29 = 0x54;
    while (bVar70 = iVar29 != 0, iVar29 = iVar29 + -1, bVar70) {
      stbi__get8(s);
    }
    iVar29 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar29 == 0) goto LAB_0012d7ef;
    iVar19 = 0x5c;
    while (bVar70 = iVar19 != 0, iVar19 = iVar19 + -1, bVar70) {
      stbi__get8(s);
    }
    uVar63 = stbi__get16be(s);
    uVar30 = stbi__get16be(s);
    iVar19 = stbi__at_eof(s);
    if (iVar19 != 0) {
      stbi__g_failure_reason = "bad file";
      return (uchar *)0x0;
    }
    bVar11 = 0;
    if (0x10000000 / uVar63 < uVar30) {
      stbi__g_failure_reason = "too large";
      return (uchar *)0x0;
    }
    stbi__get32be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    uVar46 = (ulong)(uVar63 * 4 * uVar30);
    data = (float *)malloc(uVar46);
    memset(data,0xff,uVar46);
    pbVar55 = (byte *)((long)&j.s + 2);
    lVar37 = 0;
    do {
      if (lVar37 == 10) goto LAB_0012e58e;
      sVar12 = stbi__get8(s);
      bVar18 = stbi__get8(s);
      pbVar55[-2] = bVar18;
      bVar14 = stbi__get8(s);
      pbVar55[-1] = bVar14;
      bVar14 = stbi__get8(s);
      *pbVar55 = bVar14;
      iVar19 = stbi__at_eof(s);
      if (iVar19 != 0) goto LAB_0012ea68;
      if (bVar18 != 8) goto LAB_0012e58e;
      bVar11 = bVar11 | bVar14;
      pbVar55 = pbVar55 + 3;
      lVar37 = lVar37 + 1;
    } while (sVar12 != '\0');
    *comp = 4 - (uint)((bVar11 & 0x10) == 0);
    for (uVar46 = 0; uVar46 != uVar30; uVar46 = uVar46 + 1) {
      psVar43 = (stbi_uc *)((long)data + (long)(int)(uVar63 * 4 * (int)uVar46));
      for (lVar59 = 0; lVar37 != lVar59; lVar59 = lVar59 + 1) {
        lVar60 = lVar59 * 3;
        sVar12 = j.huff_dc[0].fast[lVar60 + -7];
        if (sVar12 == '\0') {
          bVar11 = j.huff_dc[0].fast[lVar60 + -6];
          psVar52 = psVar43;
          uVar33 = uVar63;
          while (bVar70 = uVar33 != 0, uVar33 = uVar33 - 1, bVar70) {
            psVar39 = stbi__readval(s,(uint)bVar11,psVar52);
            if (psVar39 == (stbi_uc *)0x0) goto LAB_0012ea76;
            psVar52 = psVar52 + 4;
          }
        }
        else {
          psVar52 = psVar43;
          uVar33 = uVar63;
          if (sVar12 == '\x01') {
            for (; 0 < (int)uVar33; uVar33 = uVar33 - (uVar34 & 0xff)) {
              bVar11 = stbi__get8(s);
              iVar19 = stbi__at_eof(s);
              if (iVar19 != 0) goto LAB_0012ea68;
              psVar39 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar60 + -6],(stbi_uc *)coutput);
              if (psVar39 == (stbi_uc *)0x0) goto LAB_0012ea76;
              uVar34 = (uint)bVar11;
              if (uVar33 < bVar11) {
                uVar34 = uVar33;
              }
              uVar54 = uVar34 & 0xff;
              while (bVar70 = uVar54 != 0, uVar54 = uVar54 - 1, bVar70) {
                stbi__copyval((uint)j.huff_dc[0].fast[lVar60 + -6],psVar52,(stbi_uc *)coutput);
                psVar52 = psVar52 + 4;
              }
            }
          }
          else {
            if (sVar12 != '\x02') goto LAB_0012e58e;
            for (; 0 < (int)uVar33; uVar33 = uVar33 - iVar19) {
              bVar11 = stbi__get8(s);
              iVar19 = stbi__at_eof(s);
              if (iVar19 != 0) goto LAB_0012ea68;
              uVar34 = (uint)bVar11;
              if ((char)bVar11 < '\0') {
                if (uVar34 == 0x80) {
                  iVar19 = stbi__get16be(s);
                }
                else {
                  iVar19 = uVar34 - 0x7f;
                }
                if ((int)uVar33 < iVar19) goto LAB_0012ea68;
                psVar39 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar60 + -6],(stbi_uc *)coutput);
                iVar29 = iVar19;
                if (psVar39 == (stbi_uc *)0x0) goto LAB_0012ea76;
                while (iVar29 != 0) {
                  stbi__copyval((uint)j.huff_dc[0].fast[lVar60 + -6],psVar52,(stbi_uc *)coutput);
                  psVar52 = psVar52 + 4;
                  iVar29 = iVar29 + -1;
                }
              }
              else {
                iVar19 = bVar11 + 1;
                iVar29 = iVar19;
                if (uVar33 <= uVar34) goto LAB_0012ea68;
                while (bVar70 = iVar29 != 0, iVar29 = iVar29 + -1, bVar70) {
                  psVar39 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar60 + -6],psVar52);
                  if (psVar39 == (stbi_uc *)0x0) goto LAB_0012ea76;
                  psVar52 = psVar52 + 4;
                }
              }
            }
          }
        }
      }
    }
    if (data == (float *)0x0) goto LAB_0012ea76;
    goto LAB_0012ea90;
  }
  sVar12 = stbi__get8(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar12 != 'a') goto LAB_0012d61b;
  local_4890 = 0xffffffff;
  g = (stbi__gif *)calloc(1,0x4860);
  iVar19 = stbi__gif_header(s,g,comp,0);
  pcVar10 = stbi__g_failure_reason;
  if (iVar19 == 0) goto LAB_0012f1e8;
  psVar43 = g->out;
  lVar37 = (long)g->w * 4;
  __size = g->h * lVar37;
  psVar52 = (stbi_uc *)malloc(__size);
  g->out = psVar52;
  if (psVar52 == (stbi_uc *)0x0) {
    pcVar10 = "outofmem";
    goto LAB_0012f1e8;
  }
  switch((uint)g->eflags >> 2 & 7) {
  case 0:
    iVar19 = 0;
    iVar29 = 0;
    iVar57 = (int)lVar37;
    iVar45 = (int)__size;
    goto LAB_0012efea;
  case 1:
    if (psVar43 != (stbi_uc *)0x0) {
      memcpy(psVar52,psVar43,__size);
    }
    g->old_out = psVar43;
    break;
  case 2:
    if (psVar43 != (stbi_uc *)0x0) {
      memcpy(psVar52,psVar43,__size);
    }
    iVar19 = g->start_x;
    iVar29 = g->start_y;
    iVar57 = g->max_x;
    iVar45 = g->max_y;
LAB_0012efea:
    stbi__fill_gif_background(g,iVar19,iVar29,iVar57,iVar45);
    break;
  case 3:
    if (g->old_out != (stbi_uc *)0x0) {
      for (iVar19 = g->start_y; iVar19 < g->max_y; iVar19 = iVar19 + g->w * 4) {
        lVar37 = (long)iVar19 + (long)g->start_x;
        memcpy(g->out + lVar37,g->old_out + lVar37,(long)g->max_x - (long)g->start_x);
      }
    }
  }
  while (sVar12 = stbi__get8(s), sVar12 == '!') {
    sVar12 = stbi__get8(s);
    if (sVar12 == 0xf9) {
      bVar11 = stbi__get8(s);
      if (bVar11 == 4) {
        bVar11 = stbi__get8(s);
        g->eflags = (uint)bVar11;
        iVar19 = stbi__get16le(s);
        g->delay = iVar19;
        bVar11 = stbi__get8(s);
        g->transparent = (uint)bVar11;
        goto LAB_0012f0ad;
      }
      stbi__skip(s,(uint)bVar11);
    }
    else {
LAB_0012f0ad:
      while (bVar11 = stbi__get8(s), bVar11 != 0) {
        stbi__skip(s,(uint)bVar11);
      }
    }
  }
  pcVar10 = stbi__g_failure_reason;
  if (sVar12 != ';') {
    if (sVar12 == ',') {
      iVar19 = stbi__get16le(s);
      iVar29 = stbi__get16le(s);
      iVar57 = stbi__get16le(s);
      iVar45 = stbi__get16le(s);
      pcVar10 = "bad Image Descriptor";
      if ((iVar57 + iVar19 <= g->w) && (iVar45 + iVar29 <= g->h)) {
        iVar23 = g->w * 4;
        g->line_size = iVar23;
        g->start_x = iVar19 << 2;
        g->start_y = iVar29 * iVar23;
        g->max_x = (iVar57 + iVar19) * 4;
        g->max_y = iVar23 * (iVar45 + iVar29);
        g->cur_x = iVar19 << 2;
        g->cur_y = iVar29 * iVar23;
        bVar11 = stbi__get8(s);
        g->lflags = (uint)bVar11;
        iVar19 = g->line_size * 8;
        if ((bVar11 & 0x40) == 0) {
          iVar19 = g->line_size;
        }
        g->step = iVar19;
        g->parse = (int)((uint)bVar11 << 0x19) >> 0x1f & 3;
        if ((char)bVar11 < '\0') {
          pal = g->lpal;
          iVar19 = -1;
          if ((g->eflags & 1) != 0) {
            iVar19 = g->transparent;
          }
          stbi__gif_parse_colortable(s,pal,2 << (bVar11 & 7),iVar19);
        }
        else {
          if ((g->flags & 0x80) == 0) {
            pcVar10 = "missing color table";
            goto LAB_0012f1e8;
          }
          lVar37 = (long)g->transparent;
          local_4890 = 0xffffffff;
          uVar63 = 0xffffffff;
          if ((-1 < lVar37) && (uVar63 = local_4890, (g->eflags & 1) != 0)) {
            bVar11 = g->pal[lVar37][3];
            g->pal[lVar37][3] = '\0';
            uVar63 = (uint)bVar11;
          }
          local_4890 = uVar63;
          pal = g->pal;
        }
        g->color_table = *pal;
        bVar11 = stbi__get8(s);
        pcVar10 = stbi__g_failure_reason;
        if (bVar11 < 0xd) {
          uVar63 = 1 << (bVar11 & 0x1f);
          for (uVar46 = 0; uVar63 != uVar46; uVar46 = uVar46 + 1) {
            g->codes[uVar46].prefix = -1;
            g->codes[uVar46].first = (stbi_uc)uVar46;
            g->codes[uVar46].suffix = (stbi_uc)uVar46;
          }
          uVar35 = (2 << (bVar11 & 0x1f)) - 1;
          n = 0;
          uVar33 = 0;
          iVar29 = 0;
          bVar18 = 0;
          uVar34 = 0xffffffff;
          uVar54 = uVar63 + 2;
          iVar19 = bVar11 + 1;
          uVar30 = uVar35;
          do {
            while (uVar36 = uVar30, iVar57 = iVar19, uVar49 = uVar54, uVar58 = uVar34,
                  bVar14 = bVar18, iVar19 = iVar29 - iVar57, iVar57 <= iVar29) {
              uVar30 = (int)uVar33 >> ((byte)iVar57 & 0x1f);
              uVar65 = uVar33 & uVar36;
              uVar33 = uVar30;
              iVar29 = iVar19;
              bVar18 = 1;
              uVar34 = 0xffffffff;
              uVar54 = uVar63 + 2;
              iVar19 = bVar11 + 1;
              uVar30 = uVar35;
              if (uVar65 != uVar63) {
                if (uVar65 == uVar63 + 1) goto LAB_0012f822;
                if ((int)uVar49 < (int)uVar65) {
                  pcVar10 = "illegal code in raster";
                  goto LAB_0012f1e8;
                }
                pcVar10 = "no clear code";
                if ((bool)(bVar14 ^ 1)) goto LAB_0012f1e8;
                if ((int)uVar58 < 0) {
                  if (uVar65 == uVar49) {
                    pcVar10 = "illegal code in raster";
                    goto LAB_0012f1e8;
                  }
                }
                else {
                  if (0xfff < (int)uVar49) {
                    pcVar10 = "too many codes";
                    goto LAB_0012f1e8;
                  }
                  g->codes[(int)uVar49].prefix = (stbi__int16)uVar58;
                  sVar12 = g->codes[uVar58].first;
                  g->codes[(int)uVar49].first = sVar12;
                  if (uVar65 != uVar49 + 1) {
                    sVar12 = g->codes[(int)uVar65].first;
                  }
                  g->codes[(int)uVar49].suffix = sVar12;
                  uVar49 = uVar49 + 1;
                }
                stbi__out_gif_code(g,(stbi__uint16)uVar65);
                iVar19 = iVar57 + 1;
                uVar30 = ~(-1 << ((byte)iVar19 & 0x1f));
                if (0xfff < (int)uVar49 || (uVar49 & uVar36) != 0) {
                  uVar30 = uVar36;
                  iVar19 = iVar57;
                }
                bVar18 = 1;
                uVar34 = uVar65;
                uVar54 = uVar49;
              }
            }
            if (n == 0) {
              bVar18 = stbi__get8(s);
              if (bVar18 == 0) goto LAB_0012f83b;
              n = (uint)bVar18;
            }
            n = n - 1;
            bVar18 = stbi__get8(s);
            uVar33 = uVar33 | (uint)bVar18 << ((byte)iVar29 & 0x1f);
            iVar29 = iVar29 + 8;
            bVar18 = bVar14;
            uVar34 = uVar58;
            uVar54 = uVar49;
            iVar19 = iVar57;
            uVar30 = uVar36;
          } while( true );
        }
      }
    }
    else {
      pcVar10 = "unknown code";
    }
  }
LAB_0012f1e8:
  stbi__g_failure_reason = pcVar10;
  free(g->out);
  psVar42 = (stbi__context *)0x0;
LAB_0012e574:
  free(g);
  return (uchar *)psVar42;
LAB_0012dae9:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0012e565;
LAB_0012e58e:
  stbi__g_failure_reason = "bad format";
  goto LAB_0012ea76;
LAB_0012f822:
  do {
    stbi__skip(s,n);
    bVar11 = stbi__get8(s);
    n = (uint)bVar11;
  } while (bVar11 != 0);
LAB_0012f83b:
  psVar42 = (stbi__context *)g->out;
  pcVar10 = stbi__g_failure_reason;
  if (psVar42 != (stbi__context *)0x0) {
    if (local_4890 != 0xffffffff) {
      g->pal[g->transparent][3] = (stbi_uc)local_4890;
    }
    pcVar10 = stbi__g_failure_reason;
    if (psVar42 != s) {
      uVar63 = g->w;
      *x = uVar63;
      uVar30 = g->h;
      *y = uVar30;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar42 = (stbi__context *)stbi__convert_format((uchar *)psVar42,4,req_comp,uVar63,uVar30);
      }
      goto LAB_0012e574;
    }
  }
  goto LAB_0012f1e8;
LAB_0012ea68:
  stbi__g_failure_reason = "bad file";
LAB_0012ea76:
  free(data);
  data = (float *)0x0;
LAB_0012ea90:
  *x = uVar63;
  *y = uVar30;
  if (req_comp == 0) {
    req_comp = *comp;
  }
  uVar34 = 4;
LAB_0012eab0:
  puVar38 = stbi__convert_format((uchar *)data,uVar34,req_comp,uVar63,uVar30);
  return puVar38;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}